

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv__udp_send(uv_udp_send_t *req,uv_udp_t *handle,uv_buf_t *bufs,uint nbufs,sockaddr *addr,
                uint addrlen,uv_udp_send_cb send_cb)

{
  uint *puVar1;
  uint uVar2;
  uv_loop_t *puVar3;
  long *plVar4;
  int iVar5;
  uv_buf_t *__dest;
  
  if (nbufs == 0) {
    __assert_fail("nbufs > 0","src/unix/udp.c",0x18b,
                  "int uv__udp_send(uv_udp_send_t *, uv_udp_t *, const uv_buf_t *, unsigned int, const struct sockaddr *, unsigned int, uv_udp_send_cb)"
                 );
  }
  iVar5 = uv__udp_maybe_deferred_bind(handle,(uint)addr->sa_family);
  if (iVar5 == 0) {
    puVar3 = handle->loop;
    req->type = UV_UDP_SEND;
    req->active_queue[0] = puVar3->active_reqs;
    plVar4 = (long *)puVar3->active_reqs[1];
    req->active_queue[1] = plVar4;
    *plVar4 = (long)req->active_queue;
    puVar3->active_reqs[1] = req->active_queue;
    if (0x1c < addrlen) {
      __assert_fail("addrlen <= sizeof(req->addr)","src/unix/udp.c",0x193,
                    "int uv__udp_send(uv_udp_send_t *, uv_udp_t *, const uv_buf_t *, unsigned int, const struct sockaddr *, unsigned int, uv_udp_send_cb)"
                   );
    }
    memcpy(&req->addr,addr,(ulong)addrlen);
    req->send_cb = send_cb;
    req->handle = handle;
    req->nbufs = nbufs;
    __dest = req->bufsml;
    req->bufs = __dest;
    if (4 < nbufs) {
      __dest = (uv_buf_t *)malloc((ulong)nbufs << 4);
      req->bufs = __dest;
      if (__dest == (uv_buf_t *)0x0) {
        return -0xc;
      }
    }
    memcpy(__dest,bufs,(ulong)nbufs << 4);
    req->queue[0] = handle->write_queue;
    plVar4 = (long *)handle->write_queue[1];
    req->queue[1] = plVar4;
    *plVar4 = (long)req->queue;
    handle->write_queue[1] = req->queue;
    uv__io_start(handle->loop,&handle->io_watcher,4);
    uVar2 = handle->flags;
    iVar5 = 0;
    if (((uVar2 >> 0xe & 1) == 0) && (handle->flags = uVar2 | 0x4000, (uVar2 >> 0xd & 1) != 0)) {
      puVar1 = &handle->loop->active_handles;
      *puVar1 = *puVar1 + 1;
    }
  }
  return iVar5;
}

Assistant:

int uv__udp_send(uv_udp_send_t* req,
                 uv_udp_t* handle,
                 const uv_buf_t bufs[],
                 unsigned int nbufs,
                 const struct sockaddr* addr,
                 unsigned int addrlen,
                 uv_udp_send_cb send_cb) {
  int err;

  assert(nbufs > 0);

  err = uv__udp_maybe_deferred_bind(handle, addr->sa_family);
  if (err)
    return err;

  uv__req_init(handle->loop, req, UV_UDP_SEND);

  assert(addrlen <= sizeof(req->addr));
  memcpy(&req->addr, addr, addrlen);
  req->send_cb = send_cb;
  req->handle = handle;
  req->nbufs = nbufs;

  req->bufs = req->bufsml;
  if (nbufs > ARRAY_SIZE(req->bufsml))
    req->bufs = malloc(nbufs * sizeof(bufs[0]));

  if (req->bufs == NULL)
    return -ENOMEM;

  memcpy(req->bufs, bufs, nbufs * sizeof(bufs[0]));
  QUEUE_INSERT_TAIL(&handle->write_queue, &req->queue);
  uv__io_start(handle->loop, &handle->io_watcher, UV__POLLOUT);
  uv__handle_start(handle);

  return 0;
}